

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

Path * Pathie::Path::mktmpdir(Path *__return_storage_ptr__,string *name)

{
  __mode_t extraout_EDX;
  __mode_t extraout_EDX_00;
  __mode_t extraout_EDX_01;
  __mode_t extraout_EDX_02;
  __mode_t __mode;
  string *this;
  string nstr;
  string local_70;
  string local_50;
  Path local_30;
  
  temp_dir();
  make_tempname(&local_50,name);
  Path(&local_30,&local_50);
  this = &local_70;
  operator/(__return_storage_ptr__,(Path *)this,&local_30);
  __mode = extraout_EDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30.m_path._M_dataplus._M_p != &local_30.m_path.field_2) {
    operator_delete(local_30.m_path._M_dataplus._M_p);
    __mode = extraout_EDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
    __mode = extraout_EDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
    __mode = extraout_EDX_02;
  }
  mkdir(__return_storage_ptr__,(char *)this,__mode);
  utf8_to_filename(&local_70,&__return_storage_ptr__->m_path);
  chmod(local_70._M_dataplus._M_p,0x1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::mktmpdir(const std::string& name /* = "tmpd" */)
{
  Path tmp = Path::temp_dir() / Path(make_tempname(name));
  tmp.mkdir();

#ifdef _PATHIE_UNIX
  std::string nstr = tmp.native();
  chmod(nstr.c_str(), S_IRWXU); // Silently ignore failure of setting file permissions
#endif
  // TODO: How to do that on Windows?

  return tmp;
}